

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void anon_unknown.dwarf_f89de::NumberDominanceGraphNodesDfs
               (VmBlock *block,uint *preOrder,uint *postOrder)

{
  VmBlock **ppVVar1;
  uint i;
  uint uVar2;
  
  uVar2 = *preOrder;
  *preOrder = uVar2 + 1;
  block->dominanceGraphPreOrderId = uVar2;
  block->visited = true;
  for (uVar2 = 0; uVar2 < (block->dominanceChildren).count; uVar2 = uVar2 + 1) {
    ppVVar1 = SmallArray<VmBlock_*,_4U>::operator[](&block->dominanceChildren,uVar2);
    if ((*ppVVar1)->visited == false) {
      NumberDominanceGraphNodesDfs(*ppVVar1,preOrder,postOrder);
    }
  }
  uVar2 = *postOrder;
  *postOrder = uVar2 + 1;
  block->dominanceGraphPostOrderId = uVar2;
  return;
}

Assistant:

void NumberDominanceGraphNodesDfs(VmBlock* block, unsigned &preOrder, unsigned &postOrder)
	{
		block->dominanceGraphPreOrderId = preOrder++;

		block->visited = true;

		for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
		{
			VmBlock *child = block->dominanceChildren[i];

			if(!child->visited)
				NumberDominanceGraphNodesDfs(child, preOrder, postOrder);
		}

		block->dominanceGraphPostOrderId = postOrder++;
	}